

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig_catch.c
# Opt level: O0

void sig_catch(int sig,_func_void_varargs *f)

{
  _union_1457 local_b0;
  sigaction sa;
  _func_void_varargs *f_local;
  int sig_local;
  
  sa.sa_mask.__val[0xf]._0_4_ = 0;
  local_b0 = (_union_1457)f;
  sa.sa_restorer = (_func_void *)f;
  sigemptyset((sigset_t *)&sa);
  sigaction(sig,(sigaction *)&local_b0,(sigaction *)0x0);
  return;
}

Assistant:

void sig_catch(int sig,void (*f)())
{
#ifdef HASSIGACTION
  struct sigaction sa;
  sa.sa_handler = f;
  sa.sa_flags = 0;
  sigemptyset(&sa.sa_mask);
  sigaction(sig,&sa,(struct sigaction *) 0);
#else
  signal(sig,f); /* won't work under System V, even nowadays---dorks */
#endif
}